

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderBase::rleAc
          (LossyDctEncoderBase *this,half *block,unsigned_short **acPtr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unsigned_short *puVar4;
  int iVar5;
  unsigned_short uVar6;
  long lVar7;
  
  puVar4 = *acPtr;
  iVar2 = this->_numAcComp;
  iVar3 = 1;
  do {
    uVar6 = block[iVar3]._h;
    if (uVar6 == 0) {
      iVar5 = 1;
      if (iVar3 < 0x3f) {
        lVar7 = 0;
        do {
          iVar1 = (int)lVar7;
          if (block[iVar3 + iVar1 + 1]._h != 0) {
            if (lVar7 == 0) goto LAB_005a7927;
            iVar5 = iVar1 + 1;
            if (iVar3 + iVar1 == 0x3f) {
              uVar6 = 0xff00;
            }
            else {
              uVar6 = (short)lVar7 + 1U | 0xff00;
            }
            goto LAB_005a792a;
          }
          lVar7 = lVar7 + 1;
        } while (0x3f - (long)iVar3 != lVar7);
        uVar6 = 0xff00;
        iVar5 = 0x40 - iVar3;
      }
      else {
LAB_005a7927:
        uVar6 = 0;
      }
LAB_005a792a:
      *acPtr = puVar4 + 1;
      *puVar4 = uVar6;
      this->_numAcComp = iVar2 + 1;
      iVar3 = iVar5 + iVar3;
    }
    else {
      *acPtr = puVar4 + 1;
      *puVar4 = uVar6;
      this->_numAcComp = iVar2 + 1;
      iVar3 = iVar3 + 1;
    }
    iVar2 = iVar2 + 1;
    puVar4 = puVar4 + 1;
    if (0x3f < iVar3) {
      return;
    }
  } while( true );
}

Assistant:

void
DwaCompressor::LossyDctEncoderBase::rleAc
    (half *block,
     unsigned short *&acPtr)
{
    int dctComp              = 1; 
    unsigned short rleSymbol = 0x0;

    while (dctComp < 64)
    {
        int runLen = 1;
    
        //
        // If we don't have a 0, output verbatim
        //

        if (block[dctComp].bits() != rleSymbol)
        {
            *acPtr++ =  block[dctComp].bits();
            _numAcComp++;

            dctComp += runLen;
            continue;
        }

        //
        // We're sitting on a 0, so see how big the run is.
        //

        while ((dctComp+runLen < 64) && 
               (block[dctComp+runLen].bits() == rleSymbol))
        {
            runLen++;
        }

        //
        // If the run len is too small, just output verbatim
        // otherwise output our run token
        //
        // Originally, we wouldn't have a separate symbol for
        // "end of block". But in some experimentation, it looks
        // like using 0xff00 for "end of block" can save a bit
        // of space. 
        //

        if (runLen == 1)
        {
            runLen           = 1;
            *acPtr++ = block[dctComp].bits();
            _numAcComp++;

            //
            // Using 0xff00 for "end of block"
            //
        }
        else if (runLen + dctComp == 64)
        {
            //
            // Signal EOB
            //

            *acPtr++ = 0xff00;
            _numAcComp++;
        }
        else
        {
            // 
            // Signal normal run
            //

            *acPtr++   = 0xff00 | runLen;
            _numAcComp++;
        }

        //
        // Advance by runLen
        //

        dctComp += runLen;
    }
}